

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O1

string * AlternativeLoader::getContinentID
                   (string *__return_storage_ptr__,string *continentName,
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *continentData)

{
  pointer pvVar1;
  pointer pbVar2;
  size_t __n;
  bool bVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  string *__str;
  uint __val;
  uint uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *i;
  pointer pvVar9;
  bool bVar10;
  
  pvVar9 = (continentData->
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (continentData->
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar9 != pvVar1) {
    uVar8 = 0;
    do {
      pbVar2 = (pvVar9->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      __n = pbVar2->_M_string_length;
      if (__n == continentName->_M_string_length) {
        if (__n == 0) {
          bVar10 = true;
        }
        else {
          iVar6 = bcmp((pbVar2->_M_dataplus)._M_p,(continentName->_M_dataplus)._M_p,__n);
          bVar10 = iVar6 == 0;
        }
      }
      else {
        bVar10 = false;
      }
      __val = uVar8 + 1;
      if (bVar10) {
        cVar5 = '\x01';
        if (9 < __val) {
          uVar7 = __val;
          cVar4 = '\x04';
          do {
            cVar5 = cVar4;
            if (uVar7 < 100) {
              cVar5 = cVar5 + -2;
              goto LAB_00119ee3;
            }
            if (uVar7 < 1000) {
              cVar5 = cVar5 + -1;
              goto LAB_00119ee3;
            }
            if (uVar7 < 10000) goto LAB_00119ee3;
            bVar3 = 99999 < uVar7;
            uVar7 = uVar7 / 10000;
            cVar4 = cVar5 + '\x04';
          } while (bVar3);
          cVar5 = cVar5 + '\x01';
        }
LAB_00119ee3:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar5);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((__return_storage_ptr__->_M_dataplus)._M_p,
                   (uint)__return_storage_ptr__->_M_string_length,__val);
        __val = uVar8;
      }
      uVar8 = __val;
      if (bVar10) {
        return __return_storage_ptr__;
      }
      pvVar9 = pvVar9 + 1;
    } while (pvVar9 != pvVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  *(__return_storage_ptr__->_M_dataplus)._M_p = '0';
  return __return_storage_ptr__;
}

Assistant:

std::string AlternativeLoader::getContinentID(const std::string& continentName,std::vector<std::vector<std::string>> continentData) {
    unsigned int counter = 0;
    for(auto& i : continentData){
        if(i[0] == continentName){
            return std::to_string(counter + 1);
        }
        counter++;
    }
    return std::to_string(0);
}